

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libregexp.c
# Opt level: O1

int re_parse_alternative(REParseState *s,BOOL is_backward_dir)

{
  byte *pbVar1;
  bool bVar2;
  int *piVar3;
  CharRange *pCVar4;
  anon_union_128_2_3affbfe2_for_u *data;
  size_t sVar5;
  uint uVar6;
  BOOL BVar7;
  uint32_t uVar8;
  int iVar9;
  int iVar10;
  sbyte sVar11;
  uint8_t *p_3;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  undefined4 uVar15;
  int iVar16;
  uint8_t *p_4;
  CharRange *extraout_RDX;
  CharRange *extraout_RDX_00;
  CharRange *extraout_RDX_01;
  CharRange *extraout_RDX_02;
  CharRange *extraout_RDX_03;
  CharRange *extraout_RDX_04;
  CharRange *extraout_RDX_05;
  CharRange *extraout_RDX_06;
  CharRange *extraout_RDX_07;
  size_t sVar17;
  CharRange *extraout_RDX_08;
  CharRange *extraout_RDX_09;
  CharRange *extraout_RDX_10;
  CharRange *pCVar18;
  CharRange *extraout_RDX_11;
  CharRange *extraout_RDX_12;
  CharRange *pCVar19;
  byte bVar20;
  ulong uVar21;
  uint8_t uVar22;
  int iVar23;
  char *pcVar24;
  uint8_t *puVar25;
  int iVar26;
  CharRange *pCVar27;
  anon_union_128_2_3affbfe2_for_u *paVar28;
  ulong uVar29;
  size_t sVar30;
  uint32_t uVar31;
  uint8_t *p_1;
  int iVar32;
  char cVar33;
  uint8_t *p;
  CharRange cr_s;
  CharRange cr1_s;
  CharRange a;
  CharRange *local_1f0;
  undefined4 local_1e4;
  CharRange *local_1e0;
  uint8_t local_1d1;
  ulong local_1d0;
  ulong local_1c8;
  anon_union_128_2_3affbfe2_for_u *local_1c0;
  ulong local_1b8;
  CharRange *local_1b0;
  ulong local_1a8;
  CharRange *local_1a0;
  int local_198;
  int local_194;
  CharRange local_190;
  DynBuf *local_170;
  int *local_168;
  size_t local_160;
  CharRange local_158;
  CharRange local_138 [8];
  
  pCVar19 = (CharRange *)s->buf_ptr;
  uVar8 = 0;
  if (pCVar19 < (CharRange *)s->buf_end) {
    uVar21 = (ulong)(uint)is_backward_dir;
    local_160 = (s->byte_code).size;
    local_168 = &s->has_named_captures;
    paVar28 = &s->u;
    local_194 = is_backward_dir + 0x13;
    local_170 = &s->group_names;
    local_1d1 = '\f' - (char)is_backward_dir;
    local_198 = is_backward_dir + 0xb;
    local_1c8 = uVar21;
    local_1c0 = paVar28;
    do {
      data = local_1c0;
      cVar33 = (char)pCVar19->len;
      if (cVar33 == ')') {
        return 0;
      }
      if (cVar33 == '|') {
        return 0;
      }
      uVar12 = (s->byte_code).size;
      bVar20 = (byte)pCVar19->len;
      iVar10 = (int)uVar21;
      local_1f0 = pCVar19;
      local_1a8 = uVar12;
      if (0x5a < bVar20) {
        switch(bVar20) {
        case 0x5b:
          uVar21 = (ulong)(uint)s->capture_count;
          if (iVar10 != 0) {
            dbuf_putc(&s->byte_code,'\x1b');
          }
          local_1d0 = uVar21;
          cr_init(&local_190,s->opaque,lre_realloc);
          cVar33 = *(char *)((long)&pCVar19->len + 1);
          local_1b0 = (CharRange *)((long)&pCVar19->len + 1);
          if (cVar33 == '^') {
            pCVar19 = (CharRange *)((long)&pCVar19->len + 2);
            local_1b0 = pCVar19;
          }
LAB_001731c2:
          do {
            pCVar18 = local_1b0;
            uVar8 = (uint32_t)uVar21;
            if ((char)local_1b0->len == ']') {
              if (s->ignore_case == 0) goto LAB_00173806;
              pCVar19 = local_138;
              cr_init(pCVar19,local_190.mem_opaque,lre_realloc);
              local_1a0 = (CharRange *)0x7b00000061;
              iVar10 = cr_op(pCVar19,local_190.points,local_190.len,(uint32_t *)&local_1a0,2,1);
              if (iVar10 == 0) {
                if (0 < local_138[0].len) {
                  lVar13 = 0;
                  do {
                    local_138[0].points[lVar13] = local_138[0].points[lVar13] - 0x20;
                    lVar13 = lVar13 + 1;
                  } while (lVar13 < local_138[0].len);
                }
                uVar8 = cr_union1(&local_190,local_138[0].points,local_138[0].len);
                cr_free(local_138);
                if (uVar8 == 0) {
LAB_00173806:
                  if ((cVar33 == '^') && (iVar10 = cr_invert(&local_190), iVar10 != 0)) break;
                  iVar10 = re_emit_range(s,&local_190);
                  if (iVar10 != 0) goto LAB_0017382b;
                  cr_free(&local_190);
                  local_1f0 = (CharRange *)((long)&pCVar18->len + 1);
                  pCVar18 = extraout_RDX_05;
                  if ((int)local_1c8 != 0) {
                    dbuf_putc(&s->byte_code,'\x1b');
                    pCVar18 = extraout_RDX_06;
                  }
                  pCVar27 = (CharRange *)(local_1a8 & 0xffffffff);
                  goto LAB_00173c1d;
                }
              }
              else {
                cr_free(pCVar19);
              }
              break;
            }
            uVar14 = get_class_atom(s,&local_158,(uint8_t **)&local_1b0,1);
            if ((int)uVar14 < 0) goto LAB_0017382b;
            if (((char)local_1b0->len == '-') && (*(char *)((long)&local_1b0->len + 1) != ']')) {
              local_1a0 = (CharRange *)((long)&local_1b0->len + 1);
              if (uVar14 < 0x40000000) {
                uVar6 = get_class_atom(s,&local_158,(uint8_t **)&local_1a0,1);
                if ((int)uVar6 < 0) {
                  uVar14 = 4;
                  goto LAB_00173345;
                }
                if (uVar6 < 0x40000000) {
                  local_1b0 = local_1a0;
                  if (uVar14 <= uVar6) {
                    local_138[0].size = uVar6 + 1;
                    local_138[0].len = uVar14;
                    uVar14 = cr_union1(&local_190,(uint32_t *)local_138,2);
                    if (uVar14 != 0) {
                      uVar14 = 7;
                    }
                    goto LAB_00173345;
                  }
                }
                else {
                  cr_free(&local_158);
                  if (s->is_utf16 == 0) goto LAB_001732d0;
                }
              }
              else {
                if (s->is_utf16 == 0) {
LAB_001732d0:
                  uVar14 = 6;
LAB_00173345:
                  iVar10 = (*(code *)(&DAT_001810b8 + *(int *)(&DAT_001810b8 + (ulong)uVar14 * 4)))
                                     ();
                  return iVar10;
                }
                cr_free(&local_158);
              }
              re_parse_error(s,"invalid class range");
              goto LAB_0017382b;
            }
            if (uVar14 < 0x40000000) goto LAB_0017323d;
            uVar14 = cr_union1(&local_190,local_158.points,local_158.len);
            uVar21 = (ulong)uVar14;
            cr_free(&local_158);
          } while (uVar14 == 0);
          goto LAB_0017381a;
        case 0x5c:
          bVar20 = *(byte *)((long)&pCVar19->len + 1);
          if (0x41 < bVar20) {
            if (bVar20 != 0x42) {
              if (bVar20 == 0x6b) {
                if (*(char *)((long)&pCVar19->len + 2) == '<') {
                  pCVar19 = (CharRange *)((long)&pCVar19->len + 3);
                  local_138[0]._0_8_ = pCVar19;
                  iVar9 = re_parse_group_name(paVar28->error_msg,(int)local_138,
                                              (uint8_t **)(ulong)(uint)s->is_utf16,0x6b);
                  if (iVar9 == 0) {
                    uVar8 = find_group_name(s,paVar28->error_msg);
                    if ((-1 < (int)uVar8) ||
                       (uVar8 = re_parse_captures(s,&local_190.len,paVar28->error_msg),
                       -1 < (int)uVar8)) {
                      local_1f0 = (CharRange *)local_138[0]._0_8_;
                      iVar9 = 0;
                      goto LAB_00173b2c;
                    }
                    if ((s->is_utf16 == 0) && (BVar7 = re_has_named_captures(s), BVar7 == 0))
                    goto LAB_00174683;
                    re_parse_error(s,"group name not defined");
                  }
                  else {
                    if ((s->is_utf16 == 0) && (BVar7 = re_has_named_captures(s), BVar7 == 0))
                    goto LAB_0017467e;
                    pcVar24 = "invalid group name";
LAB_00173b1b:
                    re_parse_error(s,pcVar24);
                    uVar8 = 0x5c;
                  }
                  iVar9 = 1;
                }
                else {
                  local_138[0]._0_8_ = pCVar19;
                  if ((s->is_utf16 != 0) || (BVar7 = re_has_named_captures(s), BVar7 != 0)) {
                    pcVar24 = "expecting group name";
                    goto LAB_00173b1b;
                  }
LAB_0017467e:
                  uVar8 = 0x5c;
LAB_00174683:
                  iVar9 = 3;
                }
LAB_00173b2c:
                if (iVar9 == 0) goto LAB_0017376e;
                if (iVar9 != 3) goto LAB_00173ba3;
                break;
              }
              if (bVar20 != 0x62) break;
            }
            dbuf_putc(&s->byte_code,(bVar20 != 0x62) + '\x11');
            pCVar19 = (CharRange *)((long)&pCVar19->len + 2);
            pCVar18 = extraout_RDX_03;
            local_1f0 = pCVar19;
            goto LAB_001734f1;
          }
          if (bVar20 - 0x31 < 9) {
            pCVar18 = (CharRange *)((long)&pCVar19->len + 1);
            uVar12 = 0;
            local_1f0 = pCVar18;
            if (0xf5 < (byte)(bVar20 - 0x3a)) {
              uVar12 = 0;
              do {
                uVar12 = ((ulong)bVar20 + uVar12 * 10) - 0x30;
                if (0x7ffffffe < uVar12) {
                  uVar8 = 0xffffffff;
                  local_1f0 = pCVar18;
                  goto LAB_00173741;
                }
                bVar20 = *(byte *)((long)&local_1f0->len + 1);
                local_1f0 = (CharRange *)((long)&local_1f0->len + 1);
              } while (0xf5 < (byte)(bVar20 - 0x3a));
            }
            uVar8 = (uint32_t)uVar12;
LAB_00173741:
            if (-1 < (int)uVar8) {
              if (s->capture_count <= (int)uVar8) {
                if (s->total_capture_count < 0) {
                  iVar9 = re_parse_captures(s,local_168,(char *)0x0);
                  s->total_capture_count = iVar9;
                }
                if (s->total_capture_count <= (int)uVar8) goto LAB_0017379c;
              }
LAB_0017376e:
              pCVar27 = (CharRange *)(ulong)(uint)(s->byte_code).size;
              local_1d0 = (ulong)(uint)s->capture_count;
              dbuf_putc(&s->byte_code,(uint8_t)local_194);
              dbuf_putc(&s->byte_code,(uint8_t)uVar8);
              pCVar18 = extraout_RDX_04;
              goto LAB_00173c1d;
            }
LAB_0017379c:
            if (s->is_utf16 != 0) {
              pcVar24 = "back reference out of range in regular expression";
              goto LAB_0017351c;
            }
            bVar20 = (byte)pCVar18->len;
            uVar8 = (uint32_t)bVar20;
            if (uVar8 < 0x38) {
              uVar8 = 0;
              local_1f0 = pCVar18;
              if (bVar20 < 0x34) {
                local_1f0 = (CharRange *)((long)&pCVar19->len + 2);
                uVar8 = bVar20 - 0x30;
              }
              bVar20 = (byte)local_1f0->len;
              pCVar18 = local_1f0;
              if ((bVar20 & 0xf8) == 0x30) {
                uVar8 = ((uint)bVar20 + uVar8 * 8) - 0x30;
                bVar20 = *(byte *)((long)&local_1f0->len + 1);
                pCVar18 = (CharRange *)((long)&local_1f0->len + 1);
                if ((bVar20 & 0xf8) == 0x30) {
                  uVar8 = ((uint)bVar20 + uVar8 * 8) - 0x30;
                  pCVar18 = (CharRange *)((long)&local_1f0->len + 2);
                }
              }
            }
            else {
              pCVar18 = (CharRange *)((long)&pCVar19->len + 2);
            }
          }
          else {
            if (bVar20 != 0x30) break;
            local_1f0 = (CharRange *)((long)&pCVar19->len + 2);
            bVar20 = *(byte *)((long)&pCVar19->len + 2);
            if (s->is_utf16 == 0) {
              if ((bVar20 & 0xf8) == 0x30) {
                uVar8 = bVar20 - 0x30;
                bVar20 = *(byte *)((long)&pCVar19->len + 3);
                pCVar18 = (CharRange *)((long)&pCVar19->len + 3);
                if ((bVar20 & 0xf8) == 0x30) {
                  uVar8 = ((uint)bVar20 + uVar8 * 8) - 0x30;
                  pCVar18 = (CharRange *)&pCVar19->size;
                }
                goto LAB_00173b59;
              }
            }
            else if (0xfffffff5 < bVar20 - 0x3a) {
              pcVar24 = "invalid decimal escape in regular expression";
              goto LAB_0017351c;
            }
            uVar8 = 0;
            pCVar18 = local_1f0;
          }
          goto LAB_00173b59;
        case 0x5d:
switchD_00173174_caseD_5d:
          if (s->is_utf16 != 0) {
LAB_00173510:
            pcVar24 = "syntax error";
            goto LAB_0017351c;
          }
          break;
        case 0x5e:
          uVar22 = '\x05';
          goto LAB_001734ec;
        default:
          if (bVar20 == 0x7b) {
            if (s->is_utf16 != 0) goto LAB_00173510;
            bVar20 = *(byte *)((long)&pCVar19->len + 1);
            if (0xfffffff5 < bVar20 - 0x3a) {
              while (pCVar18 = (CharRange *)((long)&pCVar19->len + 1), 0xf5 < (byte)(bVar20 - 0x3a))
              {
                bVar20 = *(byte *)((long)&pCVar19->len + 2);
                pCVar19 = pCVar18;
              }
              if (((char)pCVar18->len == ',') &&
                 (bVar20 = *(byte *)((long)&pCVar19->len + 2),
                 pCVar18 = (CharRange *)((long)&pCVar19->len + 2),
                 0xf5 < (byte)(bVar20 - 0x3a) && 0xfffffff5 < bVar20 - 0x3a)) {
                do {
                  piVar3 = &pCVar18->len;
                  pCVar18 = (CharRange *)((long)&pCVar18->len + 1);
                } while (0xf5 < (byte)(*(char *)((long)piVar3 + 1) - 0x3aU));
              }
              if ((char)pCVar18->len == '}') goto switchD_00173143_caseD_2a;
            }
          }
          else if (bVar20 == 0x7d) goto switchD_00173174_caseD_5d;
        }
        goto switchD_00173143_caseD_25;
      }
      switch(bVar20) {
      case 0x24:
        uVar22 = '\x06';
LAB_001734ec:
        pCVar19 = (CharRange *)((long)&pCVar19->len + 1);
        local_1f0 = pCVar19;
        dbuf_putc(&s->byte_code,uVar22);
        pCVar18 = extraout_RDX_00;
LAB_001734f1:
        pCVar27 = (CharRange *)0xffffffff;
        local_1d0 = 0;
        break;
      case 0x25:
      case 0x26:
      case 0x27:
      case 0x29:
      case 0x2c:
      case 0x2d:
        goto switchD_00173143_caseD_25;
      case 0x28:
        if (*(char *)((long)&pCVar19->len + 1) != '?') {
          local_1f0 = (CharRange *)((long)&pCVar19->len + 1);
          dbuf_putc(local_170,'\0');
LAB_001735b1:
          uVar14 = s->capture_count;
          if (0xfe < (int)uVar14) {
            pcVar24 = "too many captures";
            goto LAB_0017351c;
          }
          pCVar19 = (CharRange *)(s->byte_code).size;
          s->capture_count = uVar14 + 1;
          dbuf_putc(&s->byte_code,(uint8_t)local_198);
          bVar20 = (byte)uVar14;
          dbuf_putc(&s->byte_code,bVar20);
          s->buf_ptr = (uint8_t *)local_1f0;
          iVar10 = re_parse_disjunction(s,iVar10);
          uVar8 = 0xffffffff;
          if (iVar10 == 0) {
            pCVar18 = (CharRange *)s->buf_ptr;
            local_1f0 = pCVar18;
            local_1e0 = pCVar19;
            local_1d0 = (ulong)uVar14;
            dbuf_putc(&s->byte_code,local_1d1);
            dbuf_putc(&s->byte_code,bVar20);
            if ((char)pCVar18->len == ')') {
              local_1f0 = (CharRange *)((long)&pCVar18->len + 1);
              pCVar18 = extraout_RDX_02;
              pCVar27 = local_1e0;
              pCVar19 = (CharRange *)(ulong)bVar20;
              break;
            }
            re_parse_error(s,"expecting \'%c\'",0x29);
            uVar21 = local_1c8;
          }
          goto LAB_00173ba3;
        }
        pcVar24 = (char *)((long)&pCVar19->len + 2);
        bVar20 = *(byte *)((long)&pCVar19->len + 2);
        bVar2 = false;
        lVar13 = 3;
        if (0x3b < bVar20) {
          if (bVar20 == 0x3c) {
            pcVar24 = (char *)((long)&pCVar19->len + 3);
            cVar33 = *(char *)((long)&pCVar19->len + 3);
            BVar7 = 1;
            bVar2 = true;
            lVar13 = 4;
            if ((cVar33 != '=') && (cVar33 != '!')) {
              local_1f0 = (CharRange *)((long)&pCVar19->len + 3);
              iVar9 = re_parse_group_name(local_1c0->error_msg,(int)&local_1f0,
                                          (uint8_t **)(ulong)(uint)s->is_utf16,1);
              paVar28 = data;
              if (iVar9 == 0) {
                iVar9 = find_group_name(s,data->error_msg);
                if (iVar9 < 1) {
                  sVar30 = strlen(data->error_msg);
                  dbuf_put(local_170,(uint8_t *)data->error_msg,sVar30 + 1);
                  s->has_named_captures = 1;
                  goto LAB_001735b1;
                }
                pcVar24 = "duplicate group name";
              }
              else {
                pcVar24 = "invalid group name";
              }
              goto LAB_0017351c;
            }
          }
          else {
            BVar7 = 0;
            if (bVar20 != 0x3d) goto LAB_0017459c;
          }
LAB_00173951:
          pCVar19 = (CharRange *)((long)&pCVar19->len + lVar13);
          uVar8 = 0xffffffff;
          local_1d0 = 0;
          if (bVar2) {
            local_1e0 = (CharRange *)0xffffffff;
          }
          else {
            local_1e0 = (CharRange *)0xffffffff;
            if (s->is_utf16 == 0) {
              local_1d0 = (ulong)(uint)s->capture_count;
              local_1e0 = (CharRange *)(uVar12 & 0xffffffff);
            }
          }
          local_1f0 = pCVar19;
          dbuf_putc(&s->byte_code,(*pcVar24 == '!') + '\x17');
          sVar17 = (s->byte_code).size;
          local_138[0]._0_8_ = local_138[0]._0_8_ & 0xffffffff00000000;
          dbuf_put(&s->byte_code,(uint8_t *)local_138,4);
          s->buf_ptr = (uint8_t *)pCVar19;
          iVar10 = re_parse_disjunction(s,BVar7);
          paVar28 = local_1c0;
          if (iVar10 != 0) goto LAB_001745b4;
          local_1f0 = (CharRange *)s->buf_ptr;
          if ((char)local_1f0->len == ')') {
            local_1f0 = (CharRange *)((long)&local_1f0->len + 1);
            dbuf_putc(&s->byte_code,'\n');
            uVar21 = local_1c8;
            if ((s->byte_code).error == 0) {
              iVar10 = (int)sVar17;
              uVar14 = ((int)(s->byte_code).size - iVar10) - 4;
              pCVar18 = (CharRange *)(ulong)uVar14;
              *(uint *)((s->byte_code).buf + iVar10) = uVar14;
              pCVar27 = local_1e0;
              break;
            }
            goto LAB_00173ba3;
          }
          re_parse_error(s,"expecting \'%c\'",0x29);
          goto LAB_001744b7;
        }
        BVar7 = 0;
        if (bVar20 == 0x21) goto LAB_00173951;
        if (bVar20 == 0x3a) {
          pCVar19 = (CharRange *)((long)&pCVar19->len + 3);
          uVar14 = s->capture_count;
          s->buf_ptr = (uint8_t *)pCVar19;
          local_1f0 = pCVar19;
          iVar10 = re_parse_disjunction(s,iVar10);
          uVar8 = 0xffffffff;
          if (iVar10 == 0) {
            local_1f0 = (CharRange *)s->buf_ptr;
            cVar33 = (char)local_1f0->len;
            local_1d0 = (ulong)uVar14;
            if (cVar33 == ')') {
              local_1f0 = (CharRange *)((long)&local_1f0->len + 1);
              pCVar18 = extraout_RDX;
            }
            else {
              re_parse_error(s,"expecting \'%c\'",0x29);
              pCVar18 = extraout_RDX_12;
            }
            pCVar27 = (CharRange *)(local_1a8 & 0xffffffff);
            paVar28 = local_1c0;
            if (cVar33 == ')') break;
            goto LAB_00173ba3;
          }
        }
        else {
LAB_0017459c:
          re_parse_error(s,"invalid group");
        }
LAB_001745b4:
        bVar2 = false;
        uVar8 = 0xffffffff;
        paVar28 = local_1c0;
        goto LAB_001744cd;
      case 0x2a:
      case 0x2b:
switchD_00173143_caseD_2a:
        pcVar24 = "nothing to repeat";
LAB_0017351c:
        re_parse_error(s,pcVar24);
        goto LAB_00173523;
      case 0x2e:
        pCVar19 = (CharRange *)((long)&pCVar19->len + 1);
        local_1d0 = (ulong)(uint)s->capture_count;
        local_1f0 = pCVar19;
        if (iVar10 == 0) {
          uVar22 = '\x04' - (s->dotall == 0);
        }
        else {
          dbuf_putc(&s->byte_code,'\x1b');
          dbuf_putc(&s->byte_code,'\x04' - (s->dotall == 0));
          uVar22 = '\x1b';
        }
        dbuf_putc(&s->byte_code,uVar22);
        pCVar18 = extraout_RDX_01;
        pCVar27 = (CharRange *)(uVar12 & 0xffffffff);
        break;
      default:
        if (bVar20 == 0x3f) goto switchD_00173143_caseD_2a;
switchD_00173143_caseD_25:
        uVar8 = get_class_atom(s,&local_190,(uint8_t **)&local_1f0,0);
        pCVar18 = local_1f0;
        if (-1 < (int)uVar8) {
LAB_00173b59:
          local_1f0 = pCVar18;
          pCVar27 = (CharRange *)(ulong)(uint)(s->byte_code).size;
          local_1d0 = (ulong)(uint)s->capture_count;
          if (iVar10 != 0) {
            dbuf_putc(&s->byte_code,'\x1b');
          }
          if ((int)uVar8 < 0x40000000) {
            if (s->ignore_case != 0) {
              uVar8 = lre_canonicalize(uVar8,s->is_utf16);
            }
            if ((int)uVar8 < 0x10000) {
              dbuf_putc(&s->byte_code,'\x01');
              local_138[0].len._0_2_ = (short)uVar8;
              sVar17 = 2;
            }
            else {
              dbuf_putc(&s->byte_code,'\x02');
              local_138[0].len = uVar8;
              sVar17 = 4;
            }
            dbuf_put(&s->byte_code,(uint8_t *)local_138,sVar17);
            pCVar18 = extraout_RDX_08;
          }
          else {
            uVar8 = re_emit_range(s,&local_190);
            cr_free(&local_190);
            pCVar18 = extraout_RDX_07;
            if (uVar8 != 0) {
LAB_00173ba3:
              uVar8 = 0xffffffff;
              bVar2 = false;
              goto LAB_001744cd;
            }
          }
          pCVar19 = pCVar27;
          if (iVar10 != 0) {
            dbuf_putc(&s->byte_code,'\x1b');
            pCVar18 = extraout_RDX_09;
          }
          break;
        }
LAB_00173523:
        bVar2 = false;
        uVar8 = 0xffffffff;
        goto LAB_001744cd;
      }
LAB_00173c1d:
      pCVar4 = local_1f0;
      uVar31 = (uint32_t)pCVar19;
      iVar10 = (int)pCVar27;
      if (iVar10 < 0) goto LAB_001744bb;
      bVar20 = (byte)local_1f0->len;
      if (bVar20 < 0x3f) {
        if (bVar20 == 0x2a) {
          uVar8 = 0;
        }
        else {
          if (bVar20 != 0x2b) goto LAB_001744bb;
          uVar8 = 1;
        }
        local_1f0 = (CharRange *)((long)&local_1f0->len + 1);
        uVar31 = 0x7fffffff;
LAB_00173dda:
        cVar33 = (char)local_1f0->len;
        uVar15 = (undefined4)CONCAT71((int7)((ulong)pCVar18 >> 8),1);
        if (cVar33 == '?') {
          local_1f0 = (CharRange *)((long)&local_1f0->len + 1);
          uVar15 = 0;
        }
        iVar9 = 0;
        if (cVar33 == '?') {
LAB_00173df7:
          uVar21 = local_1d0;
          uVar29 = (ulong)pCVar27 & 0xffffffff;
          uVar12 = (ulong)(uint)((int)(s->byte_code).size - iVar10);
          if (uVar8 == 0) {
            local_1e4 = uVar15;
            local_1b8 = uVar12;
            if ((int)local_1d0 != s->capture_count) {
              local_1e0 = pCVar27;
              iVar10 = dbuf_insert(&s->byte_code,iVar10,3);
              iVar32 = 0xc;
              if (iVar10 != 0) goto LAB_0017446a;
              (s->byte_code).buf[uVar29] = '\r';
              (s->byte_code).buf[uVar29 + 1] = (uint8_t)uVar21;
              pCVar27 = (CharRange *)(ulong)((int)local_1e0 + 3);
              (s->byte_code).buf[uVar29 + 2] = (char)s->capture_count + 0xff;
            }
            uVar8 = (uint32_t)pCVar27;
            if (uVar31 != 0x7fffffff) {
              if (uVar31 == 1) {
                iVar10 = dbuf_insert(&s->byte_code,uVar8,5);
                iVar32 = 0xc;
                if (iVar10 != 0) goto LAB_0017446a;
                (s->byte_code).buf[(ulong)pCVar27 & 0xffffffff] = (byte)local_1e4 | 8;
                *(int *)((s->byte_code).buf + ((ulong)pCVar27 & 0xffffffff) + 1) = (int)local_1b8;
              }
              else if (uVar31 == 0) {
                (s->byte_code).size = (ulong)pCVar27 & 0xffffffff;
              }
              else {
                iVar10 = dbuf_insert(&s->byte_code,uVar8,10);
                iVar32 = 0xc;
                if (iVar10 != 0) goto LAB_0017446a;
                (s->byte_code).buf[(ulong)pCVar27 & 0xffffffff] = '\x0f';
                puVar25 = (s->byte_code).buf;
                *(uint32_t *)(puVar25 + (long)(int)uVar8 + 1) = uVar31;
                puVar25[(long)(int)uVar8 + 5] = (byte)local_1e4 | 8;
                *(int *)((s->byte_code).buf + (long)(int)uVar8 + 6) = (int)local_1b8 + 5;
                re_emit_goto(s,0xe,uVar8 + 5);
                dbuf_putc(&s->byte_code,'\x10');
              }
              goto LAB_00174467;
            }
            iVar10 = dbuf_insert(&s->byte_code,uVar8,iVar9 + 5);
            iVar32 = 0xc;
            if (iVar10 == 0) {
              (s->byte_code).buf[(ulong)pCVar27 & 0xffffffff] = (byte)local_1e4 | 8;
              puVar25 = (s->byte_code).buf;
              *(int *)(puVar25 + ((ulong)pCVar27 & 0xffffffff) + 1) = (int)local_1b8 + iVar9 + 5;
              if (iVar9 == 0) {
                iVar10 = 7;
              }
              else {
                puVar25[(long)(int)uVar8 + 5] = '\x19';
                iVar10 = 0x1a;
              }
              re_emit_goto(s,iVar10,uVar8);
              goto LAB_00174467;
            }
          }
          else {
            if (((uVar8 == 1) && (uVar31 == 0x7fffffff)) && (iVar9 == 0)) {
              dbuf_putc(&s->byte_code,(byte)uVar15 ^ 9);
              local_138[0].len = (iVar10 - (int)(s->byte_code).size) + -4;
            }
            else {
              if (uVar8 != 1) {
                local_1e4 = uVar15;
                local_1e0 = pCVar27;
                local_1b8 = uVar12;
                iVar10 = dbuf_insert(&s->byte_code,iVar10,5);
                iVar32 = 0xc;
                if (iVar10 != 0) goto LAB_0017446a;
                (s->byte_code).buf[uVar29] = '\x0f';
                *(uint32_t *)((s->byte_code).buf + uVar29 + 1) = uVar8;
                iVar10 = (int)local_1e0;
                pCVar27 = (CharRange *)(ulong)(iVar10 + 5);
                dbuf_putc(&s->byte_code,'\x0e');
                local_138[0].len = (iVar10 - (int)(s->byte_code).size) + 1;
                dbuf_put(&s->byte_code,(uint8_t *)local_138,4);
                dbuf_putc(&s->byte_code,'\x10');
                uVar12 = local_1b8;
                uVar15 = local_1e4;
              }
              if (uVar31 != 0x7fffffff) {
                iVar32 = 0;
                if (uVar31 - uVar8 != 0 && (int)uVar8 <= (int)uVar31) {
                  local_1e0 = pCVar27;
                  local_1b8 = uVar12;
                  dbuf_putc(&s->byte_code,'\x0f');
                  local_138[0].len = uVar31 - uVar8;
                  dbuf_put(&s->byte_code,(uint8_t *)local_138,4);
                  sVar17 = (s->byte_code).size;
                  iVar10 = (int)local_1b8;
                  dbuf_putc(&s->byte_code,(byte)uVar15 | 8);
                  local_138[0].len = iVar10 + 5;
                  dbuf_put(&s->byte_code,(uint8_t *)local_138,4);
                  dbuf_put_self(&s->byte_code,(ulong)local_1e0 & 0xffffffff,(long)iVar10);
                  dbuf_putc(&s->byte_code,'\x0e');
                  local_138[0].len = ((int)sVar17 - (int)(s->byte_code).size) + -4;
                  dbuf_put(&s->byte_code,(uint8_t *)local_138,4);
                  dbuf_putc(&s->byte_code,'\x10');
                }
                goto LAB_0017446a;
              }
              sVar17 = (s->byte_code).size;
              iVar10 = (int)uVar12;
              local_1e0 = pCVar27;
              dbuf_putc(&s->byte_code,(byte)uVar15 | 8);
              local_138[0].len = iVar10 + iVar9 + 5;
              dbuf_put(&s->byte_code,(uint8_t *)local_138,4);
              if (iVar9 == 0) {
                dbuf_put_self(&s->byte_code,(ulong)local_1e0 & 0xffffffff,(long)iVar10);
                uVar22 = '\a';
              }
              else {
                dbuf_putc(&s->byte_code,'\x19');
                dbuf_put_self(&s->byte_code,(ulong)local_1e0 & 0xffffffff,(long)iVar10);
                uVar22 = '\x1a';
              }
              dbuf_putc(&s->byte_code,uVar22);
              local_138[0].len = ((int)sVar17 - (int)(s->byte_code).size) + -4;
            }
            dbuf_put(&s->byte_code,(uint8_t *)local_138,4);
LAB_00174467:
            iVar32 = 0;
          }
LAB_0017446a:
          if (iVar32 != 0xc) {
            paVar28 = local_1c0;
            if (iVar32 == 0) goto LAB_001744bb;
            goto LAB_001744b7;
          }
        }
        else {
          pCVar19 = (CharRange *)0x0;
          if ((int)uVar31 < 1) {
LAB_001741e1:
            iVar32 = 0xc;
            if ((s->byte_code).error == 0) {
              uVar21 = (ulong)pCVar27 & 0xffffffff;
              puVar25 = (s->byte_code).buf;
              iVar9 = (int)(s->byte_code).size - iVar10;
              local_1e4 = uVar15;
              memset(local_138,0,0xff);
              if (iVar9 < 1) {
                bVar2 = true;
                iVar32 = -2;
              }
              else {
                iVar32 = -2;
                bVar2 = false;
                iVar16 = 0;
                do {
                  uVar14 = (uint)reopcode_info[puVar25[(long)iVar16 + uVar21]].size;
                  switch(puVar25[(long)iVar16 + uVar21]) {
                  case '\x01':
                  case '\x02':
                  case '\x03':
                  case '\x04':
                    goto switchD_0017425a_caseD_1;
                  case '\x05':
                  case '\x06':
                  case '\x0f':
                  case '\x10':
                  case '\x11':
                  case '\x12':
                  case '\x19':
                  case '\x1b':
                    break;
                  default:
                    if (iVar32 == -2) {
                      iVar32 = 0;
                    }
                    break;
                  case '\v':
                  case '\f':
                    pbVar1 = (byte *)((long)&local_138[0].len +
                                     (ulong)puVar25[(long)iVar16 + uVar21 + 1]);
                    *pbVar1 = *pbVar1 | 1;
                    break;
                  case '\r':
                    uVar12 = (ulong)puVar25[(long)iVar16 + uVar21 + 1];
                    bVar20 = puVar25[(long)iVar16 + uVar21 + 2];
                    if (puVar25[(long)iVar16 + uVar21 + 1] < bVar20) {
                      do {
                        pbVar1 = (byte *)((long)&local_138[0].len + uVar12);
                        *pbVar1 = *pbVar1 | 1;
                        uVar12 = uVar12 + 1;
                      } while (bVar20 != uVar12);
                    }
                    break;
                  case '\x13':
                  case '\x14':
                    pbVar1 = (byte *)((long)&local_138[0].len +
                                     (ulong)puVar25[(long)iVar16 + uVar21 + 1]);
                    *pbVar1 = *pbVar1 | 2;
                    bVar2 = true;
                    break;
                  case '\x15':
                    sVar11 = 2;
                    goto LAB_0017429a;
                  case '\x16':
                    sVar11 = 3;
LAB_0017429a:
                    uVar14 = (uint)reopcode_info[puVar25[(long)iVar16 + uVar21]].size +
                             ((uint)*(ushort *)(puVar25 + (long)iVar16 + uVar21 + 1) << sVar11);
switchD_0017425a_caseD_1:
                    if (iVar32 == -2) {
                      iVar32 = 1;
                    }
                  }
                  iVar16 = iVar16 + uVar14;
                } while (iVar16 < iVar9);
                bVar2 = !bVar2;
              }
              if (!bVar2) {
                lVar13 = 0;
                do {
                  if (*(char *)((long)&local_138[0].len + lVar13) == '\x03') {
                    pCVar19 = (CharRange *)0x0;
                    goto LAB_00174491;
                  }
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 0xff);
              }
              pCVar19 = (CharRange *)(ulong)((iVar32 + 2U & 0xfffffffd) == 0);
LAB_00174491:
              iVar32 = 0;
              uVar15 = local_1e4;
            }
          }
          else {
            iVar32 = 0xc;
            if ((s->byte_code).error == 0) {
              local_1e0 = (CharRange *)((ulong)pCVar27 & 0xffffffff);
              iVar9 = (int)(s->byte_code).size - iVar10;
              if (iVar9 < 1) {
                iVar16 = 0;
              }
              else {
                puVar25 = (s->byte_code).buf;
                iVar26 = 0;
                iVar23 = 0;
                do {
                  bVar20 = *(byte *)((long)&local_1e0->len + (long)(puVar25 + iVar26));
                  iVar16 = -1;
                  if (0x15 < bVar20 - 1) break;
                  uVar14 = (uint)reopcode_info[bVar20].size;
                  switch((uint)bVar20) {
                  case 1:
                  case 2:
                  case 3:
                  case 4:
                    goto switchD_00173fff_caseD_1;
                  case 5:
                  case 6:
                  case 0x11:
                  case 0x12:
                    goto switchD_00173fff_caseD_5;
                  default:
                    goto switchD_00173fff_caseD_7;
                  case 0x15:
                    sVar11 = 2;
                    break;
                  case 0x16:
                    sVar11 = 3;
                  }
                  uVar14 = (uint)reopcode_info[bVar20].size +
                           ((uint)*(ushort *)
                                   ((long)&local_1e0->len + (long)(puVar25 + (long)iVar26 + 1)) <<
                           sVar11);
switchD_00173fff_caseD_1:
                  iVar23 = iVar23 + 1;
switchD_00173fff_caseD_5:
                  iVar16 = iVar23;
                  iVar26 = iVar26 + uVar14;
                  iVar23 = iVar16;
                } while (iVar26 < iVar9);
              }
switchD_00173fff_caseD_7:
              pCVar19 = pCVar27;
              local_1e4 = uVar15;
              if (iVar16 < 1) goto LAB_001741e1;
              dbuf_putc(&s->byte_code,'\n');
              iVar9 = dbuf_insert(&s->byte_code,iVar10,0x11);
              uVar15 = local_1e4;
              if (iVar9 == 0) {
                *(uint8_t *)((long)&local_1e0->len + (long)(s->byte_code).buf) = '\x1c';
                puVar25 = (s->byte_code).buf;
                *(int *)((long)&local_1e0->len + (long)(puVar25 + 1)) =
                     ((int)(s->byte_code).size - iVar10) + -0x11;
                *(uint32_t *)((long)&local_1e0->size + (long)(puVar25 + 1)) = uVar8;
                *(uint32_t *)((long)&local_1e0->points + (long)(puVar25 + 1)) = uVar31;
                *(int *)((long)&local_1e0->points + (long)(puVar25 + 5)) = iVar16;
                iVar32 = 0xd;
              }
            }
          }
          iVar9 = (int)pCVar19;
          paVar28 = local_1c0;
          if (iVar32 == 0xd) {
LAB_001744bb:
            s->buf_ptr = (uint8_t *)local_1f0;
            uVar8 = 0;
            bVar2 = true;
            uVar21 = local_1c8;
            goto LAB_001744cd;
          }
          if (iVar32 != 0xc) {
            if (iVar32 != 0) goto LAB_001744b7;
            goto LAB_00173df7;
          }
        }
        paVar28 = local_1c0;
        bVar2 = false;
        re_parse_error(s,"out of memory");
        uVar8 = 0xffffffff;
        uVar21 = local_1c8;
      }
      else {
        if (bVar20 == 0x3f) {
          local_1f0 = (CharRange *)((long)&local_1f0->len + 1);
          uVar8 = 0;
          uVar31 = 1;
          goto LAB_00173dda;
        }
        if (bVar20 != 0x7b) goto LAB_001744bb;
        bVar20 = *(byte *)((long)&local_1f0->len + 1);
        pCVar18 = (CharRange *)(ulong)(bVar20 - 0x3a);
        if (bVar20 - 0x3a < 0xfffffff6) {
          if (s->is_utf16 == 0) {
            cVar33 = '\t';
            local_1f0 = pCVar4;
          }
          else {
LAB_00173c75:
            re_parse_error(s,"invalid repetition count");
            cVar33 = '\x01';
            pCVar18 = extraout_RDX_10;
          }
        }
        else {
          pCVar18 = (CharRange *)((long)&local_1f0->len + 1);
          uVar21 = 0;
          if (0xf5 < (byte)(bVar20 - 0x3a)) {
            uVar21 = 0;
            do {
              uVar21 = ((ulong)bVar20 + uVar21 * 10) - 0x30;
              if (0x7ffffffe < uVar21) {
                uVar21 = 0x7fffffff;
              }
              bVar20 = *(byte *)((long)&pCVar18->len + 1);
              pCVar18 = (CharRange *)((long)&pCVar18->len + 1);
            } while (0xf5 < (byte)(bVar20 - 0x3a));
          }
          uVar8 = (uint32_t)uVar21;
          uVar31 = uVar8;
          local_1f0 = pCVar18;
          if ((char)pCVar18->len == ',') {
            local_1f0 = (CharRange *)((long)&pCVar18->len + 1);
            bVar20 = *(byte *)((long)&pCVar18->len + 1);
            pCVar18 = (CharRange *)(ulong)bVar20;
            uVar31 = 0x7fffffff;
            if (0xfffffff5 < bVar20 - 0x3a) {
              uVar21 = 0;
              if (0xf5 < (byte)(bVar20 - 0x3a)) {
                uVar21 = 0;
                do {
                  uVar21 = (long)pCVar18 + uVar21 * 10 + -0x30;
                  if (0x7ffffffe < uVar21) {
                    uVar21 = 0x7fffffff;
                  }
                  bVar20 = *(byte *)((long)&local_1f0->len + 1);
                  pCVar18 = (CharRange *)(ulong)bVar20;
                  local_1f0 = (CharRange *)((long)&local_1f0->len + 1);
                } while (0xf5 < (byte)(bVar20 - 0x3a));
              }
              pCVar18 = (CharRange *)0x0;
              uVar31 = (uint32_t)uVar21;
              if ((int)uVar31 < (int)uVar8) goto LAB_00173c75;
            }
          }
          cVar33 = (char)local_1f0->len;
          if ((cVar33 == '}') || (s->is_utf16 != 0)) {
            if (cVar33 == '}') {
              local_1f0 = (CharRange *)((long)&local_1f0->len + 1);
            }
            else {
              re_parse_error(s,"expecting \'%c\'",0x7d);
              pCVar18 = extraout_RDX_11;
            }
            cVar33 = cVar33 != '}';
          }
          else {
            cVar33 = '\t';
            local_1f0 = pCVar4;
          }
        }
        if (cVar33 == '\t') goto LAB_001744bb;
        if (cVar33 == '\0') goto LAB_00173dda;
LAB_001744b7:
        uVar8 = 0xffffffff;
        bVar2 = false;
        uVar21 = local_1c8;
      }
LAB_001744cd:
      if (!bVar2) {
        return uVar8;
      }
      if ((int)uVar21 != 0) {
        sVar17 = (s->byte_code).size;
        sVar30 = sVar17 - local_1a8;
        iVar10 = dbuf_realloc(&s->byte_code,sVar30 + sVar17);
        sVar5 = local_160;
        if (iVar10 != 0) {
          return -1;
        }
        puVar25 = (s->byte_code).buf + local_160;
        memmove(puVar25 + sVar30,puVar25,sVar17 - local_160);
        puVar25 = (s->byte_code).buf;
        memcpy(puVar25 + sVar5,puVar25 + sVar17,sVar30);
        paVar28 = local_1c0;
      }
      pCVar19 = (CharRange *)s->buf_ptr;
    } while (pCVar19 < (CharRange *)s->buf_end);
  }
  return 0;
LAB_0017323d:
  uVar21 = (ulong)(uVar14 + 1);
  local_138[0].size = uVar14 + 1;
  local_138[0].len = uVar14;
  iVar10 = cr_union1(&local_190,(uint32_t *)local_138,2);
  if (iVar10 != 0) {
LAB_0017381a:
    re_parse_error(s,"out of memory");
LAB_0017382b:
    cr_free(&local_190);
    goto LAB_001744b7;
  }
  goto LAB_001731c2;
}

Assistant:

static int re_parse_alternative(REParseState *s, BOOL is_backward_dir)
{
    const uint8_t *p;
    int ret;
    size_t start, term_start, end, term_size;

    start = s->byte_code.size;
    for(;;) {
        p = s->buf_ptr;
        if (p >= s->buf_end)
            break;
        if (*p == '|' || *p == ')')
            break;
        term_start = s->byte_code.size;
        ret = re_parse_term(s, is_backward_dir);
        if (ret)
            return ret;
        if (is_backward_dir) {
            /* reverse the order of the terms (XXX: inefficient, but
               speed is not really critical here) */
            end = s->byte_code.size;
            term_size = end - term_start;
            if (dbuf_realloc(&s->byte_code, end + term_size))
                return -1;
            memmove(s->byte_code.buf + start + term_size,
                    s->byte_code.buf + start,
                    end - start);
            memcpy(s->byte_code.buf + start, s->byte_code.buf + end,
                   term_size);
        }
    }
    return 0;
}